

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

_Bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it,uint32_t val)

{
  long *plVar1;
  ushort uVar2;
  roaring_bitmap_t *prVar3;
  uint16_t *puVar4;
  ulong uVar5;
  bitset_container_t *container;
  uint64_t *puVar6;
  bool bVar7;
  _Bool _Var8;
  uint uVar9;
  ushort uVar10;
  int *piVar11;
  uint8_t uVar12;
  long lVar13;
  ulong extraout_RDX;
  ushort uVar14;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  
  prVar3 = it->parent;
  iVar17 = (prVar3->high_low_container).size;
  if ((long)iVar17 == 0) {
LAB_0011a92e:
    uVar9 = iVar17 - 1;
  }
  else {
    puVar4 = (prVar3->high_low_container).keys;
    uVar10 = (ushort)(val >> 0x10);
    if (puVar4[(long)iVar17 + -1] == uVar10) goto LAB_0011a92e;
    uVar18 = iVar17 - 1;
    uVar19 = 0;
    uVar15 = uVar18;
    do {
      if ((int)uVar18 < (int)uVar19) {
        uVar9 = ~uVar19;
        break;
      }
      uVar9 = uVar19 + uVar18 >> 1;
      uVar14 = *(ushort *)((long)puVar4 + (ulong)(uVar19 + uVar18 & 0xfffffffe));
      if (uVar14 < uVar10) {
        uVar19 = uVar9 + 1;
        bVar7 = true;
        uVar9 = uVar15;
      }
      else if (uVar10 < uVar14) {
        uVar18 = uVar9 - 1;
        bVar7 = true;
        uVar9 = uVar15;
      }
      else {
        bVar7 = false;
      }
      uVar15 = uVar9;
    } while (bVar7);
  }
  if ((int)uVar9 < 0) {
    it->container_index = ~uVar9;
    goto LAB_0011ab57;
  }
  piVar11 = (int *)(prVar3->high_low_container).containers[uVar9];
  uVar12 = (prVar3->high_low_container).typecodes[uVar9];
  if (uVar12 == '\x04') {
    uVar12 = (uint8_t)piVar11[2];
    if (uVar12 == '\x04') {
      __assert_fail("*type != SHARED_CONTAINER_TYPE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                    ,0x1062,
                    "const container_t *container_unwrap_shared(const container_t *, uint8_t *)");
    }
    piVar11 = *(int **)piVar11;
  }
  if (uVar12 == '\x03') {
    lVar13 = (long)*piVar11;
    if (lVar13 == 0) goto LAB_0011aa38;
    uVar10 = *(short *)(*(long *)(piVar11 + 2) + -2 + lVar13 * 4) +
             *(short *)(*(long *)(piVar11 + 2) + -4 + lVar13 * 4);
  }
  else {
    if (uVar12 == '\x02') {
      if ((long)*piVar11 != 0) {
        uVar10 = *(ushort *)(*(long *)(piVar11 + 2) + -2 + (long)*piVar11 * 2);
        goto LAB_0011aa3a;
      }
    }
    else {
      if (uVar12 != '\x01') {
        __assert_fail("false",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/RoaringBitmap[P]croaring_cmake_demo_from_single_header/dependencies/croaring/roaring.c"
                      ,0x18c4,"uint16_t container_maximum(const container_t *, uint8_t)");
      }
      plVar1 = (long *)(piVar11 + 2);
      uVar16 = 0x400;
      iVar17 = 0xffff;
      do {
        uVar15 = (int)uVar16 - 1;
        uVar16 = (ulong)uVar15;
        uVar5 = *(ulong *)(*plVar1 + uVar16 * 8);
        lVar13 = 0x3f;
        if (uVar5 != 0) {
          for (; uVar5 >> lVar13 == 0; lVar13 = lVar13 + -1) {
          }
        }
        piVar11 = (int *)((ulong)piVar11 & 0xffffffff);
        if (uVar5 != 0) {
          piVar11 = (int *)(ulong)(iVar17 - ((uint)lVar13 ^ 0x3f));
        }
        uVar10 = (ushort)piVar11;
        if (uVar5 != 0) goto LAB_0011aa3a;
        iVar17 = iVar17 + -0x40;
      } while (1 < uVar15);
    }
LAB_0011aa38:
    uVar10 = 0;
  }
LAB_0011aa3a:
  uVar14 = (ushort)val;
  uVar15 = val & 0xffff;
  if (uVar10 < uVar15) {
    it->container_index = uVar9 + 1;
  }
  else {
    it->container_index = uVar9;
    iter_new_container_partial_init(it);
    container = (bitset_container_t *)it->container;
    if (it->typecode == '\x03') {
      puVar6 = container->words;
      iVar17 = container->cardinality + -1;
      uVar9 = 0;
      uVar16 = extraout_RDX;
      do {
        if (iVar17 < (int)uVar9) {
          uVar18 = ~uVar9;
          break;
        }
        uVar18 = uVar9 + iVar17 >> 1;
        uVar2 = *(ushort *)((long)puVar6 + (ulong)uVar18 * 4);
        if (uVar2 < uVar14) {
          uVar9 = uVar18 + 1;
          bVar7 = true;
        }
        else if (uVar14 < uVar2) {
          iVar17 = uVar18 - 1;
          bVar7 = true;
        }
        else {
          bVar7 = false;
          uVar16 = (ulong)uVar18;
        }
        uVar18 = (uint)uVar16;
      } while (bVar7);
      uVar9 = uVar18;
      if (((int)uVar18 < 0) &&
         ((uVar18 == 0xffffffff ||
          (uVar9 = -uVar18 - 2,
          (int)(uint)*(ushort *)((long)puVar6 + (ulong)uVar9 * 4 + 2) <
          (int)(uVar15 - *(ushort *)((long)puVar6 + (ulong)uVar9 * 4)))))) {
        uVar9 = 0xffffffff;
        if ((int)~uVar18 < container->cardinality) {
          uVar9 = ~uVar18;
        }
      }
      it->run_index = uVar9;
      uVar9 = (uint)*(ushort *)((long)puVar6 + (long)(int)uVar9 * 4);
      if (uVar15 < uVar9) {
        val = uVar9 | it->highbits;
      }
    }
    else {
      if (it->typecode == '\x02') {
        puVar6 = container->words;
        iVar17 = container->cardinality + -1;
        uVar9 = 0;
        uVar16 = extraout_RDX;
        do {
          if (iVar17 < (int)uVar9) {
            uVar18 = ~uVar9;
            break;
          }
          uVar18 = uVar9 + iVar17 >> 1;
          uVar2 = *(ushort *)((long)puVar6 + (ulong)(uVar9 + iVar17 & 0xfffffffe));
          if (uVar2 < uVar14) {
            uVar9 = uVar18 + 1;
            bVar7 = true;
          }
          else if (uVar14 < uVar2) {
            iVar17 = uVar18 - 1;
            bVar7 = true;
          }
          else {
            bVar7 = false;
            uVar16 = (ulong)uVar18;
          }
          uVar18 = (uint)uVar16;
        } while (bVar7);
        uVar9 = 0xffffffff;
        if ((int)~uVar18 < container->cardinality) {
          uVar9 = ~uVar18;
        }
        if (-1 < (int)uVar18) {
          uVar9 = uVar18;
        }
        it->in_container_index = uVar9;
        uVar9 = (uint)*(ushort *)((long)puVar6 + (long)(int)uVar9 * 2);
      }
      else {
        uVar9 = bitset_container_index_equalorlarger(container,uVar14);
        it->in_container_index = uVar9;
      }
      val = uVar9 | it->highbits;
    }
    it->current_value = val;
    it->has_value = true;
  }
  if (uVar15 <= uVar10) {
    return true;
  }
LAB_0011ab57:
  _Var8 = loadfirstvalue(it);
  it->has_value = _Var8;
  return _Var8;
}

Assistant:

bool roaring_move_uint32_iterator_equalorlarger(roaring_uint32_iterator_t *it, uint32_t val) {
    uint16_t hb = val >> 16;
    const int i = ra_get_index(& it->parent->high_low_container, hb);
    if (i >= 0) {
      uint32_t lowvalue = container_maximum(it->parent->high_low_container.containers[i], it->parent->high_low_container.typecodes[i]);
      uint16_t lb = val & 0xFFFF;
      if(lowvalue < lb ) {
        it->container_index = i+1; // will have to load first value of next container
      } else {// the value is necessarily within the range of the container
        it->container_index = i;
        it->has_value = loadfirstvalue_largeorequal(it, val);
        return it->has_value;
      }
    } else {
      // there is no matching, so we are going for the next container
      it->container_index = -i-1;
    }
    it->has_value = loadfirstvalue(it);
    return it->has_value;
}